

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

void __thiscall
particleSamples::addParticleQuantumNumber
          (particleSamples *this,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *input_particle_list)

{
  pointer ppvVar1;
  pointer paVar2;
  int iVar3;
  anon_struct_120_15_f999644b *part_i;
  pointer paVar4;
  vector<particle_info,_std::allocator<particle_info>_> **ev_i;
  pointer ppvVar5;
  
  ppvVar1 = (input_particle_list->
            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppvVar5 = (input_particle_list->
                 super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppvVar5 != ppvVar1;
      ppvVar5 = ppvVar5 + 1) {
    paVar2 = ((*ppvVar5)->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    for (paVar4 = ((*ppvVar5)->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                  _M_impl.super__Vector_impl_data._M_start; paVar4 != paVar2; paVar4 = paVar4 + 1) {
      iVar3 = particle_decay::get_particle_baryon_number(this->decayer_ptr,paVar4->monval);
      paVar4->baryon = iVar3;
    }
  }
  return;
}

Assistant:

void particleSamples::addParticleQuantumNumber(
    vector<vector<particle_info> *> *input_particle_list) {
    for (auto &ev_i : (*input_particle_list)) {
        for (auto &part_i : (*ev_i)) {
            part_i.baryon =
                (decayer_ptr->get_particle_baryon_number(part_i.monval));
        }
    }
}